

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

void __thiscall duckdb::Binder::AddBoundView(Binder *this,ViewCatalogEntry *view)

{
  iterator iVar1;
  BinderException *this_00;
  element_type *peVar2;
  allocator local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  peVar2 = this;
  while( true ) {
    local_68._M_dataplus._M_p = (pointer)view;
    if (peVar2 == (Binder *)0x0) {
      ::std::__detail::
      _Insert<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::ViewCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::ViewCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::ViewCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::ViewCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)&this->bound_views,(value_type *)&local_68);
      return;
    }
    iVar1 = ::std::
            _Hashtable<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::ViewCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::ViewCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(peVar2->bound_views)._M_h,(key_type *)&local_68);
    if (iVar1.super__Node_iterator_base<std::reference_wrapper<duckdb::ViewCatalogEntry>,_true>.
        _M_cur != (__node_type *)0x0) break;
    peVar2 = (peVar2->parent).internal.
             super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_68,
             "infinite recursion detected: attempting to recursively bind view \"%s\"",&local_69);
  ::std::__cxx11::string::string
            ((string *)&local_48,
             (string *)&(view->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  BinderException::BinderException<std::__cxx11::string>(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Binder::AddBoundView(ViewCatalogEntry &view) {
	// check if the view is already bound
	auto current = this;
	while (current) {
		if (current->bound_views.find(view) != current->bound_views.end()) {
			throw BinderException("infinite recursion detected: attempting to recursively bind view \"%s\"", view.name);
		}
		current = current->parent.get();
	}
	bound_views.insert(view);
}